

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pragma_newline_spacing(CTcTokenizer *this)

{
  tc_toktyp_t tVar1;
  int iVar2;
  size_t sVar3;
  short *psVar4;
  long *plVar5;
  char *pcVar6;
  byte *in_RDI;
  newline_spacing_mode_t f;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if ((*in_RDI >> 2 & 1) != 0) {
    return;
  }
  tVar1 = next_on_line((CTcTokenizer *)0x29aa7f);
  if ((tVar1 != TOKT_LPAR) || (tVar1 = next_on_line((CTcTokenizer *)0x29aa8d), tVar1 != TOKT_SYM)) {
    log_warning(0x271f);
    goto LAB_0029ac53;
  }
  sVar3 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
  if ((sVar3 == 2) &&
     (psVar4 = (short *)CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8)), *psVar4 == 0x6e6f)) {
    in_stack_fffffffffffffff4 = 1;
  }
  else {
    sVar3 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
    if ((sVar3 == 8) &&
       (plVar5 = (long *)CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8)),
       *plVar5 == 0x657370616c6c6f63)) {
      in_stack_fffffffffffffff4 = 1;
    }
    else {
      sVar3 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
      if (sVar3 == 3) {
        pcVar6 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
        iVar2 = memcmp(pcVar6,"off",3);
        if (iVar2 == 0) {
          in_stack_fffffffffffffff4 = 0;
          goto LAB_0029ac2c;
        }
      }
      sVar3 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
      if (sVar3 == 6) {
        pcVar6 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
        iVar2 = memcmp(pcVar6,"delete",6);
        if (iVar2 == 0) {
          in_stack_fffffffffffffff4 = 0;
          goto LAB_0029ac2c;
        }
      }
      sVar3 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
      if ((sVar3 != 8) ||
         (plVar5 = (long *)CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8)),
         *plVar5 != 0x6576726573657270)) {
        log_warning(0x271f);
        goto LAB_0029ac53;
      }
      in_stack_fffffffffffffff4 = 2;
    }
  }
LAB_0029ac2c:
  tVar1 = next_on_line((CTcTokenizer *)0x29ac35);
  if (tVar1 == TOKT_RPAR) {
    *(undefined4 *)(in_RDI + 4) = in_stack_fffffffffffffff4;
  }
  else {
    log_warning(0x271f);
  }
LAB_0029ac53:
  clear_linebuf((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void CTcTokenizer::pragma_newline_spacing()
{
    newline_spacing_mode_t f;

    /* if we're in preprocess-only mode, just pass the pragma through */
    if (pp_only_mode_)
        return;
    
    /* get the '(' token and the on/off token */
    if (next_on_line() != TOKT_LPAR || next_on_line() != TOKT_SYM)
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* note the new mode flag */
    if (curtok_.get_text_len() == 2
        && memcmp(curtok_.get_text(), "on", 2) == 0)
    {
        /* 'on' - this is the old version of 'collapse' */
        f = NEWLINE_SPACING_COLLAPSE;
    }
    else if (curtok_.get_text_len() == 8
             && memcmp(curtok_.get_text(), "collapse", 8) == 0)
    {
        f = NEWLINE_SPACING_COLLAPSE;
    }
    else if (curtok_.get_text_len() == 3
             && memcmp(curtok_.get_text(), "off", 3) == 0)
    {
        /* 'off' - the old version of 'delete' */
        f = NEWLINE_SPACING_DELETE;
    }
    else if (curtok_.get_text_len() == 6
             && memcmp(curtok_.get_text(), "delete", 6) == 0)
    {
        f = NEWLINE_SPACING_DELETE;
    }
    else if (curtok_.get_text_len() == 8
             && memcmp(curtok_.get_text(), "preserve", 8) == 0)
    {
        f = NEWLINE_SPACING_PRESERVE;
    }
    else
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* make sure we have the ')' token */
    if (next_on_line() != TOKT_RPAR)
    {
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* set the new mode */
    string_newline_spacing_ = f;

done:
    /* done - discard this line buffer */
    clear_linebuf();
}